

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcConstructionMaterialResource::IfcConstructionMaterialResource
          (IfcConstructionMaterialResource *this)

{
  IfcConstructionMaterialResource *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1b8,"IfcConstructionMaterialResource");
  IfcConstructionResource::IfcConstructionResource
            (&this->super_IfcConstructionResource,&PTR_construction_vtable_24__00fde368);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionMaterialResource,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionMaterialResource,_2UL> *)
             &(this->super_IfcConstructionResource).field_0x178,
             &PTR_construction_vtable_24__00fde458);
  *(undefined8 *)&this->super_IfcConstructionResource = 0xfde260;
  *(undefined8 *)&this->field_0x1b8 = 0xfde350;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x88 = 0xfde288;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x98 = 0xfde2b0;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0xd0 = 0xfde2d8;
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)0xfde300;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x178 = 0xfde328;
  STEP::Maybe<Assimp::STEP::ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_0UL>_>::Maybe
            ((Maybe<Assimp::STEP::ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_0UL>_> *)
             &(this->super_IfcConstructionResource).field_0x188);
  STEP::Maybe<double>::Maybe(&this->UsageRatio);
  return;
}

Assistant:

IfcConstructionMaterialResource() : Object("IfcConstructionMaterialResource") {}